

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::NetworkHttpClient::handleCleanup
          (NetworkHttpClient *this,
          map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
          *hosts,iterator iter)

{
  EntropySource *pEVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  SourceLocation location_00;
  undefined8 uVar3;
  void *pvVar4;
  long in_RCX;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6200:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6202:10)>
  *location_01;
  OwnPromiseNode OVar5;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6442:15)>
  *location_02;
  OwnPromiseNode intermediate;
  OwnPromiseNode intermediate_1;
  void *continuationTracePtr;
  undefined1 local_a0 [16];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_88;
  char *local_80;
  char *pcStack_78;
  undefined8 local_70;
  Maybe<kj::EntropySource_&> local_68;
  Maybe<kj::HttpClientErrorHandler_&> local_60;
  OwnPromiseNode local_58;
  anon_class_24_3_c36c7980_for_func local_50;
  OwnPromiseNode local_38;
  
  pEVar1 = *(EntropySource **)(in_RCX + 0x50);
  if (*(_func_int ***)(pEVar1 + 0x20) == (_func_int **)0x0) {
    local_38.ptr = (PromiseNode *)this;
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_a0);
    uVar3 = local_a0._0_8_;
    local_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_78 = "onDrained";
    local_70 = 0xe00001838;
    local_50.this =
         (NetworkHttpClient *)
         kj::_::
         TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6200:39),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6202:10)>
         ::anon_class_8_1_8991fb9c_for_func::operator();
    pPVar2 = ((PromiseArenaMember *)local_a0._0_8_)->arena;
    local_68.ptr = pEVar1;
    local_60.ptr = (HttpClientErrorHandler *)pEVar1;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_a0._0_8_ - (long)pPVar2) < 0x30) {
      pvVar4 = operator_new(0x400);
      location_01 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6200:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6202:10)>
                     *)((long)pvVar4 + 0x3d0);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda()_1_,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda()_1_,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda(kj::Exception&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
                 (anon_class_8_1_8991fb9c_for_func *)&local_60,
                 (anon_class_8_1_8991fb9c_for_errorHandler *)&local_68,&local_50.this);
      *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
    }
    else {
      ((PromiseArenaMember *)local_a0._0_8_)->arena = (PromiseArena *)0x0;
      location_01 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6200:39),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6202:10)>
                     *)(local_a0._0_8_ + -0x30);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda()_1_,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda()_1_,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::onDrained()::_lambda(kj::Exception&&)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
                 (anon_class_8_1_8991fb9c_for_func *)&local_60,
                 (anon_class_8_1_8991fb9c_for_errorHandler *)&local_68,&local_50.this);
      (((PromiseNode *)(uVar3 + -0x30))->super_PromiseArenaMember).arena = pPVar2;
    }
    location.function = pcStack_78;
    location.fileName = local_80;
    location.lineNumber = (undefined4)local_70;
    location.columnNumber = local_70._4_4_;
    local_90.ptr = (PromiseNode *)location_01;
    kj::_::maybeChain<void>(&local_58,(Promise<void> *)&local_90,location);
    this = (NetworkHttpClient *)local_38.ptr;
    OVar5.ptr = local_58.ptr;
    local_58.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
    local_a0._8_8_ = OVar5.ptr;
    local_88.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_88);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0);
  }
  else {
    NetworkAddressHttpClient::onDrained((NetworkAddressHttpClient *)(local_a0 + 8));
    OVar5.ptr = (PromiseNode *)local_a0._8_8_;
  }
  local_90.ptr = (PromiseNode *)
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6442:15)>
                 ::anon_class_24_3_c36c7980_for_func::operator();
  pPVar2 = (((ForkHub<kj::_::Void> *)OVar5.ptr)->super_ForkHubBase).super_PromiseArenaMember.arena;
  local_50.this = (NetworkHttpClient *)hosts;
  local_50.hosts =
       (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
        *)iter._M_node;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)OVar5.ptr - (long)pPVar2) < 0x38) {
    pvVar4 = operator_new(0x400);
    location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6442:15)>
                   *)((long)pvVar4 + 0x3c8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::NetworkHttpClient::handleCleanup(std::map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::handleCleanup(std::map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>)::_lambda()_1_,void*&>
              (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_a0 + 8),
               &local_50,&local_90.ptr);
    *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
  }
  else {
    (((ForkHub<kj::_::Void> *)OVar5.ptr)->super_ForkHubBase).super_PromiseArenaMember.arena =
         (PromiseArena *)0x0;
    location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6442:15)>
                   *)((long)&(((ForkHub<kj::_::Void> *)((long)OVar5.ptr + -0x218))->result).
                             super_ExceptionOrValue.exception.ptr.field_1 + 0x160);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::NetworkHttpClient::handleCleanup(std::map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::handleCleanup(std::map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>)::_lambda()_1_,void*&>
              (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_a0 + 8),
               &local_50,&local_90.ptr);
    *(PromiseArena **)
     ((long)&(((ForkHub<kj::_::Void> *)((long)OVar5.ptr + -0x218))->result).super_ExceptionOrValue.
             exception.ptr.field_1 + 0x168) = pPVar2;
  }
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h";
  pcStack_78 = "then";
  local_70 = 0x4c0000058b;
  location_00.function = &DAT_0042a1d1;
  location_00.fileName = &DAT_0042a172;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  local_88.ptr = (PromiseNode *)location_02;
  kj::_::maybeChain<void>((OwnPromiseNode *)local_a0,(Promise<void> *)&local_88,location_00);
  uVar3 = local_a0._0_8_;
  local_a0._0_8_ = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0);
  this->super_HttpClient = uVar3;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_88);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_a0 + 8));
  return (Promise<void>)(PromiseNode *)this;
}

Assistant:

kj::Promise<void> handleCleanup(std::map<kj::StringPtr, Host>& hosts,
                                  std::map<kj::StringPtr, Host>::iterator iter) {
    return iter->second.client->onDrained()
        .then([this,&hosts,iter]() -> kj::Promise<void> {
      // Double-check that it's really drained to avoid race conditions.
      if (iter->second.client->isDrained()) {
        hosts.erase(iter);
        return kj::READY_NOW;
      } else {
        return handleCleanup(hosts, iter);
      }
    });
  }